

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::Options::add_to_option(Options *this,string *option,string *arg)

{
  iterator iVar1;
  option_not_exists_exception *this_00;
  __shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
          ::find(&(this->m_options)._M_t,option);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_options)._M_t._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,
               (__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)
               (iVar1._M_node + 2));
    OptionDetails::parse(local_28._M_ptr,arg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    return;
  }
  this_00 = (option_not_exists_exception *)__cxa_allocate_exception(0x28);
  option_not_exists_exception::option_not_exists_exception(this_00,option);
  __cxa_throw(this_00,&option_not_exists_exception::typeinfo,OptionException::~OptionException);
}

Assistant:

void
Options::add_to_option(const std::string& option, const std::string& arg)
{
  auto iter = m_options.find(option);

  if (iter == m_options.end())
  {
    throw option_not_exists_exception(option);
  }

  parse_option(iter->second, option, arg);
}